

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTable::MemTable(MemTable *this,InternalKeyComparator *comparator)

{
  KeyComparator local_38 [2];
  InternalKeyComparator *local_18;
  InternalKeyComparator *comparator_local;
  MemTable *this_local;
  
  local_18 = comparator;
  comparator_local = (InternalKeyComparator *)this;
  KeyComparator::KeyComparator(&this->comparator_,comparator);
  this->refs_ = 0;
  Arena::Arena(&this->arena_);
  KeyComparator::KeyComparator(local_38,&this->comparator_);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
            (&this->table_,local_38,&this->arena_);
  KeyComparator::~KeyComparator(local_38);
  return;
}

Assistant:

MemTable::MemTable(const InternalKeyComparator& comparator)
    : comparator_(comparator), refs_(0), table_(comparator_, &arena_) {}